

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Player * createInstance<ExampleBot>(string *name)

{
  Player *this;
  string local_30 [32];
  string *local_10;
  string *name_local;
  
  local_10 = name;
  this = (Player *)operator_new(0x40);
  std::__cxx11::string::string(local_30,(string *)name);
  ExampleBot::ExampleBot((ExampleBot *)this,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  return this;
}

Assistant:

Player *createInstance(std::string name) { return new T{name}; }